

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk8c(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk8c_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk8c.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk8c.version);
    if ((bios->power).unk8c.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk8c.offset + 1,&(bios->power).unk8c.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk8c.offset + 2,&(bios->power).unk8c.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk8c.offset + 3,&(bios->power).unk8c.entriesnum);
      (bios->power).unk8c.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk8c.entriesnum;
      peVar5 = (envy_bios_power_unk8c_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk8c.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk8c.rlen * (int)uVar6 +
             (uint)(bios->power).unk8c.hlen + (bios->power).unk8c.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER GC6 table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk8c(struct envy_bios *bios) {
	struct envy_bios_power_unk8c *unk8c = &bios->power.unk8c;
	int i, err = 0;

	if (!unk8c->offset)
		return -EINVAL;

	bios_u8(bios, unk8c->offset + 0x0, &unk8c->version);
	switch(unk8c->version) {
	case 0x10:
		err |= bios_u8(bios, unk8c->offset + 0x1, &unk8c->hlen);
		err |= bios_u8(bios, unk8c->offset + 0x2, &unk8c->rlen);
		err |= bios_u8(bios, unk8c->offset + 0x3, &unk8c->entriesnum);
		unk8c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER GC6 table version 0x%x\n", unk8c->version);
		return -EINVAL;
	};

	err = 0;
	unk8c->entries = malloc(unk8c->entriesnum * sizeof(struct envy_bios_power_unk8c_entry));
	for (i = 0; i < unk8c->entriesnum; i++) {
		uint32_t data = unk8c->offset + unk8c->hlen + i * unk8c->rlen;

		unk8c->entries[i].offset = data;
	}

	return 0;
}